

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int32_t __thiscall
aeron::archive::AeronArchive::listRecordingsForUri
          (AeronArchive *this,int64_t fromRecordingId,int32_t recordCount,string *channelFragment,
          int32_t streamId,RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  int32_t streamId_local;
  int32_t recordCount_local;
  int64_t fromRecordingId_local;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  streamId_local = streamId;
  recordCount_local = recordCount;
  fromRecordingId_local = fromRecordingId;
  local_48._M_unused._M_object = operator_new(0x28);
  *(AeronArchive **)local_48._M_unused._0_8_ = this;
  *(int64_t **)((long)local_48._M_unused._0_8_ + 8) = &fromRecordingId_local;
  *(int32_t **)((long)local_48._M_unused._0_8_ + 0x10) = &recordCount_local;
  *(string **)((long)local_48._M_unused._0_8_ + 0x18) = channelFragment;
  *(int32_t **)((long)local_48._M_unused._0_8_ + 0x20) = &streamId_local;
  pcStack_30 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:259:9)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:259:9)>
             ::_M_manager;
  iVar1 = callAndPollForDescriptors
                    (this,(function<bool_(long)> *)&local_48,recordCount,consumer,
                     "list recordings for URI");
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecordingsForUri(std::int64_t fromRecordingId, std::int32_t recordCount,
                                                const std::string& channelFragment, std::int32_t streamId,
                                                RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return archiveProxy_->listRecordingsForUri(fromRecordingId, recordCount, channelFragment, streamId, correlationId,
                                                       controlSessionId_);
        },
        recordCount, std::move(consumer), "list recordings for URI");
}